

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

Var __thiscall Js::SourceTextModuleRecord::ModuleEvaluation(SourceTextModuleRecord *this)

{
  code *pcVar1;
  bool bVar2;
  char16 *pcVar3;
  ScriptContext *pSVar4;
  ScriptConfiguration *this_00;
  JavascriptLibrary *pJVar5;
  RecyclableObject *pRVar6;
  void **ppvVar7;
  undefined4 *puVar8;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> **ppSVar9;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar10;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar11;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar12;
  Var errorObject;
  JavascriptExceptionObject *exception;
  JavascriptException *err;
  SourceTextModuleRecord *this_local;
  
  pcVar3 = GetSpecifierSz(this);
  Output::TraceWithFlush(ModulePhase,L"ModuleEvaluation(%s)\n",pcVar3);
  bVar2 = ModuleRecordBase::WasEvaluated(&this->super_ModuleRecordBase);
  if ((!bVar2) && (bVar2 = IsEvaluating(this), !bVar2)) {
    pSVar4 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
    this_00 = ScriptContext::GetConfig(pSVar4);
    bVar2 = ScriptConfiguration::IsES6ModuleEnabled(this_00);
    if (bVar2) {
      bVar2 = WasEvaluationPrepassed(this);
      if ((!bVar2) && (bVar2 = ModuleEvaluationPrepass(this), !bVar2)) {
        pSVar4 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
        pJVar5 = ScriptContext::GetLibrary(pSVar4);
        pRVar6 = JavascriptLibraryBase::GetUndefined(&pJVar5->super_JavascriptLibraryBase);
        return pRVar6;
      }
      ppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&this->errorObject);
      if (*ppvVar7 != (void *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x431,"(this->errorObject == nullptr)",
                                    "this->errorObject == nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      SetEvaluating(this,true);
      ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                          ((WriteBarrierPtr *)&this->requestedModuleList);
      if (*ppSVar9 != (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        pSVar10 = Memory::WriteBarrierPtr<SList<Ident_*,_Memory::ArenaAllocator,_RealCount>_>::
                  operator->(&this->requestedModuleList);
        SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>::Reverse
                  (&pSVar10->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>);
        pSVar10 = Memory::WriteBarrierPtr<SList<Ident_*,_Memory::ArenaAllocator,_RealCount>_>::
                  operator->(&this->requestedModuleList);
        SListBase<Ident*,Memory::ArenaAllocator,RealCount>::
        Map<Js::SourceTextModuleRecord::ModuleEvaluation()::__0>
                  ((SListBase<Ident*,Memory::ArenaAllocator,RealCount> *)pSVar10,
                   (anon_class_8_1_8991fb9c_for_fn)this);
      }
      if (this->awaitedModules == 0) {
        FinishModuleEvaluation(this,true);
      }
      else {
        ppLVar11 = Memory::WriteBarrierPtr::operator_cast_to_List__
                             ((WriteBarrierPtr *)&this->parentModuleList);
        if (*ppLVar11 !=
            (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)0x0) {
          pLVar12 = Memory::
                    WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                    ::operator->(&this->parentModuleList);
          JsUtil::
          List<Js::SourceTextModuleRecord*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
          ::Map<Js::SourceTextModuleRecord::ModuleEvaluation()::__1>
                    ((List<Js::SourceTextModuleRecord*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                      *)pLVar12);
        }
      }
      pSVar4 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
      pJVar5 = ScriptContext::GetLibrary(pSVar4);
      pRVar6 = JavascriptLibraryBase::GetUndefined(&pJVar5->super_JavascriptLibraryBase);
      return pRVar6;
    }
  }
  return (Var)0x0;
}

Assistant:

Var SourceTextModuleRecord::ModuleEvaluation()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ModuleEvaluation(%s)\n"), this->GetSpecifierSz());

        if (WasEvaluated() || IsEvaluating() || !scriptContext->GetConfig()->IsES6ModuleEnabled())
        {
            return nullptr;
        }

        try
        {
            if (!WasEvaluationPrepassed())
            {
                if (!ModuleEvaluationPrepass())
                {
                    return scriptContext->GetLibrary()->GetUndefined();
                }
            }

            Assert(this->errorObject == nullptr);
            SetEvaluating(true);
            
            if (requestedModuleList != nullptr)
            {
                requestedModuleList->Reverse();
                requestedModuleList->Map([&](IdentPtr specifier) {
                    SourceTextModuleRecord* childModuleRecord = nullptr;
                    AssertOrFailFast(childrenModuleSet->TryGetValue(specifier->Psz(), &childModuleRecord));

                    childModuleRecord->ModuleEvaluation();
                    // if child module was evaluated before and threw need to re-throw now
                    // if child module has been dynamically imported and has exception need to throw
                    if (childModuleRecord->GetErrorObject() != nullptr)
                    {
                        this->ReleaseParserResourcesForHierarchy();

                        JavascriptExceptionOperators::Throw(childModuleRecord->GetErrorObject(), this->scriptContext);
                    }
                });
            }
            if (awaitedModules == 0)
            {
                FinishModuleEvaluation(true);
            }
            else
            {
                if (this->parentModuleList != nullptr)
                {
                    parentModuleList->Map([=](uint i, SourceTextModuleRecord* parentModule)
                    {
                        parentModule->IncrementAwaited();
                    });
                }
            }
        }
        catch (const Js::JavascriptException &err)
        {
            if (!WasEvaluated())
            {
                SetWasEvaluated();
            }
            SetEvaluating(false);
            JavascriptExceptionObject *exception = err.GetAndClear();
            Var errorObject = exception->GetThrownObject(scriptContext);
            AssertOrFailFastMsg(errorObject != nullptr, "ModuleEvaluation: null error object thrown from root function");
            this->errorObject = errorObject;
            if (this->promise != nullptr)
            {
                ResolveOrRejectDynamicImportPromise(false, errorObject, scriptContext, this, false);
            }
            if (isRootModule && !ReportModuleCompletion(this, errorObject))
            {
                JavascriptExceptionOperators::DoThrowCheckClone(exception, scriptContext);
            }
        }

        return scriptContext->GetLibrary()->GetUndefined();
    }